

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

int Intp_ManProofRecordOne(Intp_Man_t *p,Sto_Cls_t *pClause)

{
  Vec_Ptr_t *pVVar1;
  Sto_Cls_t *pFinal;
  int iVar2;
  Sto_Cls_t *pSVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar5 = *(uint *)&pClause->field_0x1c;
  if ((uVar5 & 0x7fffff8) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a2,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if ((uVar5 & 2) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a6,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  uVar6 = 0;
  while ((uVar5 >> 3 & 0xffffff) != uVar6) {
    iVar2 = *(int *)((long)&pClause[1].pNext + uVar6 * 4);
    uVar6 = uVar6 + 1;
    if (p->pAssigns[iVar2 >> 1] == iVar2) goto LAB_00710c5c;
  }
  uVar6 = 0;
  while (uVar6 < (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff)) {
    iVar2 = Intp_ManEnqueue(p,*(uint *)((long)&pClause[1].pNext + uVar6 * 4) ^ 1,(Sto_Cls_t *)0x0);
    uVar6 = uVar6 + 1;
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                    ,0x2b7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
    }
  }
  pSVar3 = Intp_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2bf,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  uVar5 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  uVar7 = *(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff;
  if (uVar5 < uVar7) {
LAB_00710c77:
    Intp_ManProofTraceOne(p,pSVar3,pClause);
    Intp_ManCancelUntil(p,p->nRootSize);
    uVar5 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
    if (uVar5 < 2) {
      if (uVar5 != 1) {
        __assert_fail("pClause->nLits == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                      ,0x2e7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
      }
      iVar2 = Intp_ManEnqueue(p,*(lit *)&pClause[1].pNext,pClause);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                      ,0x2ec,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
      }
      pSVar3 = Intp_ManPropagate(p,p->nRootSize);
      if (pSVar3 != (Sto_Cls_t *)0x0) {
        while( true ) {
          pVVar1 = p->vAntClas;
          pFinal = p->pCnf->pEmpty;
          if (pFinal->Id - p->nAntStart <= pVVar1->nSize) break;
          pVVar4 = Vec_IntAlloc(0);
          Vec_PtrPush(pVVar1,pVVar4);
        }
        Intp_ManProofTraceOne(p,pSVar3,pFinal);
        return 0;
      }
      p->nRootSize = p->nTrailSize;
    }
    else {
      Intp_ManWatchClause(p,pClause,*(lit *)&pClause[1].pNext);
      Intp_ManWatchClause(p,pClause,*(lit *)((long)&pClause[1].pNext + 4));
    }
  }
  else {
    for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      uVar8 = 0;
      while( true ) {
        if (uVar5 == uVar8) goto LAB_00710c4d;
        if (*(int *)((long)&pSVar3[1].pNext + uVar6 * 4) ==
            *(int *)((long)&pClause[1].pNext + uVar8 * 4)) break;
        uVar8 = uVar8 + 1;
      }
      if (uVar5 == (uint)uVar8) {
LAB_00710c4d:
        if (uVar7 != (uint)uVar6) goto LAB_00710c77;
        break;
      }
    }
    Intp_ManCancelUntil(p,p->nRootSize);
LAB_00710c5c:
    pVVar1 = p->vAntClas;
    pVVar4 = Vec_IntAlloc(0);
    Vec_PtrPush(pVVar1,pVVar4);
  }
  return 1;
}

Assistant:

int Intp_ManProofRecordOne( Intp_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
        {
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }

    // add assumptions to the trail
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Intp_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    }

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Intp_ManCancelUntil( p, p->nRootSize );
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }
    }

    // construct the proof
    Intp_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Intp_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Intp_ManWatchClause( p, pClause, pClause->pLits[0] );
        Intp_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Intp_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // insert place-holders till the empty clause
        while ( Vec_PtrSize(p->vAntClas) < p->pCnf->pEmpty->Id - p->nAntStart )
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
        // construct the proof for the empty clause
        Intp_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
//        if ( p->fVerbose )
//            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}